

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O1

int writeMPS(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
            vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex,
            vector<double,_std::allocator<double>_> *Avalue,
            vector<double,_std::allocator<double>_> *colCost,
            vector<double,_std::allocator<double>_> *colLower,
            vector<double,_std::allocator<double>_> *colUpper,
            vector<double,_std::allocator<double>_> *rowLower,
            vector<double,_std::allocator<double>_> *rowUpper,
            vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  pointer piVar6;
  int *piVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  bool bVar9;
  FILE *__s;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  double v;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> r_ty;
  uint local_9c;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  int *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  value_type_conflict1 local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  printf("writeMPS: Trying to open file %s\n",filename);
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    puts("writeMPS: Not opened file OK");
    iVar11 = 1;
  }
  else {
    puts("writeMPS: Opened file  OK");
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)*numRow);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_78,(long)*numRow,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_98,(long)*numRow,&local_50);
    uVar12 = (ulong)(uint)*numRow;
    if (0 < *numRow) {
      pdVar3 = (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        dVar1 = pdVar3[lVar16];
        dVar2 = pdVar4[lVar16];
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (1e+200 <= dVar2) {
            if (-1e+200 < dVar1) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar16] = 3;
              goto LAB_00155036;
            }
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar16] = 0;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16] = 0.0;
          }
          else {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar16] = 2;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16] = dVar2;
            dVar1 = pdVar3[lVar16];
            if (-1e+200 < dVar1) {
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] = pdVar4[lVar16] - dVar1;
            }
          }
        }
        else {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar16] = 1;
LAB_00155036:
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16] = dVar1;
        }
        lVar16 = lVar16 + 1;
        uVar12 = (ulong)*numRow;
      } while (lVar16 < (long)uVar12);
    }
    iVar11 = (int)uVar12;
    uVar12 = uVar12 & 0xffffffff;
    bVar18 = 0 < iVar11;
    if (((0 < iVar11) &&
        (*local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == 0.0)) &&
       (!NAN(*local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start))) {
      uVar17 = 1;
      while (uVar15 = uVar17, uVar12 != uVar15) {
        if ((local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15] != 0.0) ||
           (uVar17 = uVar15 + 1,
           NAN(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15]))) break;
      }
      bVar18 = uVar15 < uVar12;
    }
    bVar19 = 0 < iVar11;
    if (((0 < iVar11) &&
        (*local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start == 0.0)) &&
       (!NAN(*local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start))) {
      uVar17 = 1;
      while (uVar15 = uVar17, uVar12 != uVar15) {
        if ((local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15] != 0.0) ||
           (uVar17 = uVar15 + 1,
           NAN(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15]))) break;
      }
      bVar19 = uVar15 < uVar12;
    }
    uVar12 = (ulong)*numCol;
    pcVar13 = "False";
    bVar20 = 0 < (long)uVar12;
    if ((long)uVar12 < 1) {
LAB_001551c0:
      pcVar10 = "False";
    }
    else {
      pdVar5 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *pdVar5;
      pcVar10 = "True";
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        uVar17 = 1;
        while (1e+200 <= (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar17 - 1]) {
          bVar20 = uVar17 < uVar12;
          if (uVar17 == uVar12) goto LAB_001551c0;
          dVar1 = pdVar5[uVar17];
          uVar17 = uVar17 + 1;
          if ((dVar1 != 0.0) || (NAN(dVar1))) break;
        }
      }
    }
    pcVar14 = "False";
    if (bVar18) {
      pcVar14 = "True";
    }
    if (bVar19) {
      pcVar13 = "True";
    }
    local_58 = Astart;
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",pcVar14,pcVar13,pcVar10
          );
    fwrite("NAME\n",5,1,__s);
    fwrite("ROWS\n",5,1,__s);
    fwrite(" N  COST\n",9,1,__s);
    if (0 < *numRow) {
      uVar12 = 0;
      do {
        pcVar13 = " N  R%-7d\n";
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar12] - 1U < 3) {
          pcVar13 = &DAT_0015be3c +
                    *(int *)(&DAT_0015be3c +
                            (ulong)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar12] - 1U) * 4);
        }
        uVar12 = uVar12 + 1;
        fprintf(__s,pcVar13,uVar12 & 0xffffffff);
      } while ((long)uVar12 < (long)*numRow);
    }
    local_60 = numRow;
    fwrite("COLUMNS\n",8,1,__s);
    pvVar8 = local_58;
    if (0 < *numCol) {
      bVar18 = false;
      local_9c = 0;
      uVar12 = 0;
      do {
        iVar11 = (integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        if (iVar11 == 0) {
LAB_0015530b:
          if (bVar18) {
            pcVar13 = "    MARK%04d  \'MARKER\'                 \'INTEND\'\n";
            bVar9 = false;
LAB_0015531b:
            bVar18 = bVar9;
            fprintf(__s,pcVar13,(ulong)local_9c);
            local_9c = local_9c + 1;
          }
        }
        else {
          pcVar13 = "    MARK%04d  \'MARKER\'                 \'INTORG\'\n";
          bVar9 = true;
          if (!bVar18) goto LAB_0015531b;
          if (iVar11 == 0) goto LAB_0015530b;
        }
        dVar1 = (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          fprintf(__s,"    C%-7d  COST      %12g\n",(ulong)((int)uVar12 + 1));
        }
        piVar6 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = piVar6[uVar12];
        lVar16 = (long)iVar11;
        uVar17 = uVar12 + 1;
        if (iVar11 < piVar6[uVar12 + 1]) {
          do {
            fprintf(__s,"    C%-7d  R%-7d  %12g\n",
                    (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar16],uVar17 & 0xffffffff,
                    (ulong)((Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar16] + 1));
            lVar16 = lVar16 + 1;
          } while (lVar16 < (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar17]);
        }
        uVar12 = uVar17;
      } while ((long)uVar17 < (long)*numCol);
    }
    fwrite("RHS\n",4,1,__s);
    piVar7 = local_60;
    if (0 < *local_60) {
      uVar12 = 0;
      do {
        pdVar5 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12;
        uVar12 = uVar12 + 1;
        fprintf(__s,"    RHS_V     R%-7d  %12g\n",*pdVar5,uVar12 & 0xffffffff);
      } while ((long)uVar12 < (long)*piVar7);
    }
    if ((bVar19) && (fwrite("RANGES\n",7,1,__s), 0 < *piVar7)) {
      lVar16 = 0;
      do {
        if ((local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16] != 0.0) ||
           (NAN(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16]))) {
          fprintf(__s,"    RANGE     R%-7d  %12g\n",(ulong)((int)lVar16 + 1));
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < *piVar7);
    }
    if ((bVar20) && (fwrite("BOUNDS\n",7,1,__s), 0 < *numCol)) {
      lVar16 = 0;
      do {
        dVar1 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        dVar2 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar16];
        iVar11 = (int)lVar16;
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (dVar2 < 1e+200) {
            fprintf(__s," UP BOUND     C%-7d  %12g\n",(ulong)(iVar11 + 1));
          }
          if (dVar1 <= -1e+200) {
            fprintf(__s," MI BOUND     C%-7d\n",(ulong)(iVar11 + 1));
          }
          else {
            pcVar13 = " LO BOUND     C%-7d  %12g\n";
            if ((dVar1 != 0.0) || (NAN(dVar1))) goto LAB_00155525;
          }
        }
        else {
          pcVar13 = " FX BOUND     C%-7d  %12g\n";
LAB_00155525:
          fprintf(__s,pcVar13,dVar1,(ulong)(iVar11 + 1));
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < *numCol);
    }
    fwrite("ENDATA\n",7,1,__s);
    fclose(__s);
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

int writeMPS(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
	     vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
	     vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	     vector<double>& rowLower, vector<double>& rowUpper,
	     vector<int>& integerColumn) {

#ifdef JAJH_dev
    printf("writeMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "w");
    if (file == 0) {
#ifdef JAJH_dev
      printf("writeMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("writeMPS: Opened file  OK\n");
#endif
    vector<int> r_ty;
    vector<double> rhs, ranges;
    bool have_rhs = false;
    bool have_ranges = false;
    bool have_bounds = false;
    r_ty.resize(numRow);
    rhs.assign(numRow, 0);
    ranges.assign(numRow, 0);
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rowLower[r_n] == rowUpper[r_n]) {
	//Equality constraint - Type E - range = 0
	r_ty[r_n] = MPS_ROW_TY_E;
	rhs[r_n] = rowLower[r_n];
      } else if (!hsol_isInfinity(rowUpper[r_n])) {
	//Upper bounded constraint - Type L
	r_ty[r_n] = MPS_ROW_TY_L;
	rhs[r_n] = rowUpper[r_n];
	if (!hsol_isInfinity(-rowLower[r_n])) {
	  //Boxed constraint - range = u-l
	  ranges[r_n] = rowUpper[r_n]-rowLower[r_n];
	}
      } else if (!hsol_isInfinity(-rowLower[r_n])) {
	//Lower bounded constraint - Type G
	r_ty[r_n] = MPS_ROW_TY_G;
	rhs[r_n] = rowLower[r_n];
      } else {
	//Free constraint - Type N
	r_ty[r_n] = MPS_ROW_TY_N;
	rhs[r_n] = 0;
      }
    }
    
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rhs[r_n]) {
	have_rhs = true;
	break;
      }
    }
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (ranges[r_n]) {
	have_ranges = true;
	break;
      }
    }
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (colLower[c_n]) {
	have_bounds = true;
	break;
      }
      if (!hsol_isInfinity(colUpper[c_n])) {
	have_bounds = true;
	break;
      }
    }
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",
	   BoolToString(have_rhs), BoolToString(have_ranges), BoolToString(have_bounds));
    
    //Field:    1           2          3         4         5         6
    //Columns:  2-3        5-12      15-22     25-36     40-47     50-61
    //         1         2         3         4         5         6
    //1234567890123456789012345678901234567890123456789012345678901
    //x11x22222222xx33333333xx444444444444xxx55555555xx666666666666
    fprintf(file, "NAME\n");
    fprintf(file, "ROWS\n");
    fprintf(file, " N  COST\n");	
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (r_ty[r_n] == MPS_ROW_TY_E) {
	fprintf(file, " E  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_G) {
	fprintf(file, " G  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_L) {
	fprintf(file, " L  R%-7d\n", r_n+1);	
      } else {
	fprintf(file, " N  R%-7d\n", r_n+1);	
      }
    }
    bool integerFg = false;
    int nIntegerMk = 0;
    fprintf(file, "COLUMNS\n");
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (integerColumn[c_n] && !integerFg) {
	//Start an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTORG'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = true;
      } else if (!integerColumn[c_n] && integerFg) {
	//End an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTEND'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = false;
      }
      if (colCost[c_n] != 0) {
	double v = colCost[c_n];
	fprintf(file, "    C%-7d  COST      %12g\n", c_n+1, v);	
      }
      for (int el_n = Astart[c_n]; el_n<Astart[c_n+1]; el_n++) {
	double v = Avalue[el_n];
	int r_n = Aindex[el_n];
	fprintf(file, "    C%-7d  R%-7d  %12g\n", c_n+1, r_n+1, v);	
      }
    }
    have_rhs = true;
    if (have_rhs) {
      fprintf(file, "RHS\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = rhs[r_n];
	//	if (v !=0)
	  fprintf(file, "    RHS_V     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_ranges) {
      fprintf(file, "RANGES\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = ranges[r_n];
	if (v !=0) fprintf(file, "    RANGE     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_bounds) {
      fprintf(file, "BOUNDS\n");
      for (int c_n = 0; c_n < numCol; c_n++) {
	double lb = colLower[c_n];
	double ub = colUpper[c_n];
	if (lb == ub) {
	  fprintf(file, " FX BOUND     C%-7d  %12g\n", c_n+1, lb);
	} else {
	  if (!hsol_isInfinity(ub)) {
	    //Upper bounded variable
	    fprintf(file, " UP BOUND     C%-7d  %12g\n", c_n+1, ub);
	  }
	  if (!hsol_isInfinity(-lb)) {
	      //Lower bounded variable - default is 0
	      if (lb) {
		fprintf(file, " LO BOUND     C%-7d  %12g\n", c_n+1, lb);
	      }
	    } else {
	      //Infinite lower bound
	      fprintf(file, " MI BOUND     C%-7d\n", c_n+1);
	  }
	}
      }
    }
    fprintf(file, "ENDATA\n");
    fclose(file);
    return 0;
}